

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.h
# Opt level: O3

void __thiscall
CoreML::Specification::NonMaximumSuppression::clear_stringclasslabels(NonMaximumSuppression *this)

{
  ulong uVar1;
  StringVector *this_00;
  undefined8 *puVar2;
  
  if (this->_oneof_case_[1] == 100) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 == (undefined8 *)0x0) {
      this_00 = (this->ClassLabels_).stringclasslabels_;
      if (this_00 != (StringVector *)0x0) {
        StringVector::~StringVector(this_00);
      }
      operator_delete(this_00,0x30);
    }
    this->_oneof_case_[1] = 0;
  }
  return;
}

Assistant:

inline bool NonMaximumSuppression::_internal_has_stringclasslabels() const {
  return ClassLabels_case() == kStringClassLabels;
}